

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::MultiSampleLineRasterizer::rasterize
          (MultiSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  undefined8 *puVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint in_EAX;
  long lVar13;
  float *pfVar14;
  long lVar15;
  int numPacketsRasterized2;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  TriangleRasterizer::rasterize
            (&this->m_triangleRasterizer0,fragmentPackets,depthValues,maxFragmentPackets,
             numPacketsRasterized);
  iVar2 = *numPacketsRasterized;
  lVar15 = (long)iVar2;
  if (0 < lVar15) {
    lVar13 = 0;
    do {
      pfVar14 = (float *)((long)fragmentPackets->barycentric[1].m_data + lVar13);
      fVar3 = *pfVar14;
      fVar4 = pfVar14[1];
      fVar5 = pfVar14[2];
      fVar6 = pfVar14[3];
      pfVar14 = (float *)((long)fragmentPackets->barycentric[2].m_data + lVar13);
      fVar7 = *pfVar14;
      fVar8 = pfVar14[1];
      fVar9 = pfVar14[2];
      fVar10 = pfVar14[3];
      puVar1 = (undefined8 *)((long)fragmentPackets->barycentric[2].m_data + lVar13);
      *puVar1 = 0;
      puVar1[1] = 0;
      pfVar14 = (float *)((long)fragmentPackets->barycentric[1].m_data + lVar13);
      *pfVar14 = fVar7 + fVar3;
      pfVar14[1] = fVar8 + fVar4;
      pfVar14[2] = fVar9 + fVar5;
      pfVar14[3] = fVar10 + fVar6;
      lVar13 = lVar13 + 0x40;
    } while (lVar15 << 6 != lVar13);
  }
  if (maxFragmentPackets != iVar2) {
    pfVar14 = depthValues + this->m_numSamples * iVar2 * 4;
    if (depthValues == (float *)0x0) {
      pfVar14 = (float *)0x0;
    }
    uStack_38 = (ulong)(uint)uStack_38;
    TriangleRasterizer::rasterize
              (&this->m_triangleRasterizer1,fragmentPackets + lVar15,pfVar14,
               maxFragmentPackets - iVar2,(int *)((long)&uStack_38 + 4));
    *numPacketsRasterized = *numPacketsRasterized + uStack_38._4_4_;
    if (0 < (long)uStack_38._4_4_) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)fragmentPackets[lVar15].barycentric[0].m_data + lVar13);
        uVar11 = *puVar1;
        uVar12 = puVar1[1];
        pfVar14 = (float *)((long)fragmentPackets[lVar15].barycentric[1].m_data + lVar13);
        fVar3 = *pfVar14;
        fVar4 = pfVar14[1];
        fVar5 = pfVar14[2];
        fVar6 = pfVar14[3];
        pfVar14 = (float *)((long)fragmentPackets[lVar15].barycentric[2].m_data + lVar13);
        fVar7 = *pfVar14;
        fVar8 = pfVar14[1];
        fVar9 = pfVar14[2];
        fVar10 = pfVar14[3];
        puVar1 = (undefined8 *)((long)fragmentPackets[lVar15].barycentric[2].m_data + lVar13);
        *puVar1 = 0;
        puVar1[1] = 0;
        pfVar14 = (float *)((long)fragmentPackets[lVar15].barycentric[0].m_data + lVar13);
        *pfVar14 = fVar7 + fVar3;
        pfVar14[1] = fVar8 + fVar4;
        pfVar14[2] = fVar9 + fVar5;
        pfVar14[3] = fVar10 + fVar6;
        puVar1 = (undefined8 *)((long)fragmentPackets[lVar15].barycentric[1].m_data + lVar13);
        *puVar1 = uVar11;
        puVar1[1] = uVar12;
        lVar13 = lVar13 + 0x40;
      } while ((long)uStack_38._4_4_ * 0x40 != lVar13);
    }
  }
  return;
}

Assistant:

void MultiSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	m_triangleRasterizer0.rasterize(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);

	// Remove 3rd barycentric value and rebalance. Lines do not have non-zero barycentric at index 2
	for (int packNdx = 0; packNdx < numPacketsRasterized; ++packNdx)
	for (int fragNdx = 0; fragNdx < 4; fragNdx++)
	{
		float removedValue = fragmentPackets[packNdx].barycentric[2][fragNdx];
		fragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
		fragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;
	}

	// rasterizer 0 filled the whole buffer?
	if (numPacketsRasterized == maxFragmentPackets)
		return;

	{
		FragmentPacket* const nextFragmentPackets	= fragmentPackets + numPacketsRasterized;
		float* nextDepthValues						= (depthValues) ? (depthValues+4*numPacketsRasterized*m_numSamples) : (DE_NULL);
		int numPacketsRasterized2					= 0;

		m_triangleRasterizer1.rasterize(nextFragmentPackets, nextDepthValues, maxFragmentPackets - numPacketsRasterized, numPacketsRasterized2);

		numPacketsRasterized += numPacketsRasterized2;

		// Fix swapped barycentrics in the second triangle
		for (int packNdx = 0; packNdx < numPacketsRasterized2; ++packNdx)
		for (int fragNdx = 0; fragNdx < 4; fragNdx++)
		{
			float removedValue = nextFragmentPackets[packNdx].barycentric[2][fragNdx];
			nextFragmentPackets[packNdx].barycentric[2][fragNdx] = 0.0f;
			nextFragmentPackets[packNdx].barycentric[1][fragNdx] += removedValue;

			// edge has reversed direction
			std::swap(nextFragmentPackets[packNdx].barycentric[0][fragNdx], nextFragmentPackets[packNdx].barycentric[1][fragNdx]);
		}
	}
}